

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_util.cpp
# Opt level: O3

void bin_io::open_fileW(fstream *f,char *filename)

{
  ostream *poVar1;
  runtime_error *this;
  
  std::fstream::open((char *)f,(_Ios_Openmode)filename);
  if (((byte)f[*(long *)(*(long *)f + -0x18) + 0x20] & 5) == 0) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"file open failed: ",0x12);
  poVar1 = std::operator<<((ostream *)&std::cout,filename);
  std::endl<char,std::char_traits<char>>(poVar1);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"file failed to open.");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void open_fileW(std::fstream& f, const char* filename) {
    f.open(filename, std::fstream::out | std::fstream::binary | std::ios::app);
    if (f.fail()) {
        std::cout << "file open failed: " << filename << std::endl;
        throw std::runtime_error("file failed to open.");
    }
}